

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FieldOptions::Swap(FieldOptions *this,FieldOptions *other)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  string *psVar4;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar5;
  
  if (other != this) {
    iVar2 = this->ctype_;
    this->ctype_ = other->ctype_;
    other->ctype_ = iVar2;
    bVar1 = this->packed_;
    this->packed_ = other->packed_;
    other->packed_ = bVar1;
    bVar1 = this->lazy_;
    this->lazy_ = other->lazy_;
    other->lazy_ = bVar1;
    bVar1 = this->deprecated_;
    this->deprecated_ = other->deprecated_;
    other->deprecated_ = bVar1;
    psVar4 = this->experimental_map_key_;
    this->experimental_map_key_ = other->experimental_map_key_;
    other->experimental_map_key_ = psVar4;
    bVar1 = this->weak_;
    this->weak_ = other->weak_;
    other->weak_ = bVar1;
    internal::RepeatedPtrFieldBase::Swap
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
               &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
    uVar3 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar3;
    pvVar5 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar5;
    iVar2 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar2;
    internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
    return;
  }
  return;
}

Assistant:

void FieldOptions::Swap(FieldOptions* other) {
  if (other != this) {
    std::swap(ctype_, other->ctype_);
    std::swap(packed_, other->packed_);
    std::swap(lazy_, other->lazy_);
    std::swap(deprecated_, other->deprecated_);
    std::swap(experimental_map_key_, other->experimental_map_key_);
    std::swap(weak_, other->weak_);
    uninterpreted_option_.Swap(&other->uninterpreted_option_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
    _extensions_.Swap(&other->_extensions_);
  }
}